

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteRaw(CodedOutputStream *this,void *data,int size)

{
  bool bVar1;
  
  do {
    if (size <= this->buffer_size_) {
      memcpy(this->buffer_,data,(long)size);
      this->buffer_ = this->buffer_ + size;
      this->buffer_size_ = this->buffer_size_ - size;
      return;
    }
    memcpy(this->buffer_,data,(long)this->buffer_size_);
    size = size - this->buffer_size_;
    data = (void *)((long)data + (long)this->buffer_size_);
    bVar1 = Refresh(this);
  } while (bVar1);
  return;
}

Assistant:

void CodedOutputStream::WriteRaw(const void* data, int size) {
  while (buffer_size_ < size) {
    memcpy(buffer_, data, buffer_size_);
    size -= buffer_size_;
    data = reinterpret_cast<const uint8*>(data) + buffer_size_;
    if (!Refresh()) return;
  }

  memcpy(buffer_, data, size);
  Advance(size);
}